

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawingprimitive_sse2_p.h
# Opt level: O2

QRgb qUnpremultiply_sse4(QRgb p)

{
  short sVar1;
  short sVar2;
  short sVar3;
  ulong uVar4;
  byte bVar5;
  undefined1 in_XMM0 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (p >> 0x18 != 0xff) {
    if (p >> 0x18 != 0) {
      auVar6._4_12_ = in_XMM0._4_12_;
      auVar6._0_4_ = (float)(p >> 0x18);
      auVar8._4_4_ = in_XMM0._4_4_;
      auVar8._0_4_ = auVar6._0_4_;
      auVar8._8_4_ = in_XMM0._8_4_;
      auVar8._12_4_ = in_XMM0._12_4_;
      auVar9 = rcpss(auVar8,auVar6);
      fVar7 = auVar9._0_4_;
      fVar7 = ((fVar7 + fVar7) - auVar6._0_4_ * fVar7 * fVar7) * 255.0;
      auVar6 = pmovzxbd(ZEXT416(p),ZEXT416(p));
      auVar9._0_4_ = (int)((float)auVar6._0_4_ * fVar7);
      auVar9._4_4_ = (int)((float)auVar6._4_4_ * fVar7);
      auVar9._8_4_ = (int)((float)auVar6._8_4_ * fVar7);
      auVar9._12_4_ = (int)((float)auVar6._12_4_ * fVar7);
      auVar6 = packusdw(auVar9,auVar9);
      bVar5 = (byte)(p >> 0x18);
      uVar4 = auVar6._0_8_ & 0xffffffffffff;
      sVar1 = (short)uVar4;
      sVar2 = (short)(uVar4 >> 0x10);
      sVar3 = (short)(uVar4 >> 0x20);
      return CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                      CONCAT12((0 < sVar3) * (sVar3 < 0x100) * (char)(uVar4 >> 0x20) -
                               (0xff < sVar3),
                               CONCAT11((0 < sVar2) * (sVar2 < 0x100) * (char)(uVar4 >> 0x10) -
                                        (0xff < sVar2),
                                        (0 < sVar1) * (sVar1 < 0x100) * (char)uVar4 - (0xff < sVar1)
                                       )));
    }
    p = 0;
  }
  return p;
}

Assistant:

static inline QRgb qUnpremultiply_sse4(QRgb p)
{
    const uint alpha = qAlpha(p);
    if (alpha == 255)
        return p;
    if (alpha == 0)
        return 0;
    const __m128 va = _mm_set1_ps(alpha);
    __m128 via;
    reciprocal_mul_ss(via, va, 255.0f); // Approximate 1/a
    __m128i vl = _mm_cvtepu8_epi32(_mm_cvtsi32_si128(p));
    vl = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(vl), via));
    vl = _mm_packus_epi32(vl, vl);
    vl = _mm_insert_epi16(vl, alpha, 3);
    vl = _mm_packus_epi16(vl, vl);
    return _mm_cvtsi128_si32(vl);
}